

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterators_example.cc
# Opt level: O3

int main(int argc,char **argv)

{
  __node_base _Var1;
  ostream *poVar2;
  long *plVar3;
  pointer pcVar4;
  long lVar5;
  initializer_list<char> __l;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  copy_of_pair;
  vector<char,_std::allocator<char>_> my_chars;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  name_to_id;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  char *local_d0;
  long local_c8;
  char local_c0 [16];
  int local_b0;
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined4 local_88;
  vector<char,_std::allocator<char>_> local_80;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  local_d0 = (char *)CONCAT35(local_d0._5_3_,0x6564636261);
  __l._M_len = 5;
  __l._M_array = (iterator)&local_d0;
  std::vector<char,_std::allocator<char>_>::vector(&local_80,__l,(allocator_type *)&local_68);
  pcVar4 = local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Print out the vector:\n",0x16);
  if (pcVar4 != local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      local_d0 = (char *)CONCAT71(local_d0._1_7_,*pcVar4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_d0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  pcVar4 = local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
           _M_start;
  *local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start
       = 'x';
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Print out the vector:\n",0x16);
  if (pcVar4 != local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      local_d0 = (char *)CONCAT71(local_d0._1_7_,*pcVar4);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,(char *)&local_d0,1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      pcVar4 = pcVar4 + 1;
    } while (pcVar4 != local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  }
  local_d0 = local_c0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"victor","");
  local_b0 = 1;
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"john","");
  local_88 = 2;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::_Hashtable<std::pair<std::__cxx11::string_const,int>const*>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,int>,std::allocator<std::pair<std::__cxx11::string_const,int>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)&local_68,&local_d0,&local_80,0,&local_d1,&local_d2,&local_d3);
  lVar5 = 0;
  do {
    if (local_98 + lVar5 != *(undefined1 **)((long)local_a8 + lVar5)) {
      operator_delete(*(undefined1 **)((long)local_a8 + lVar5));
    }
    lVar5 = lVar5 + -0x28;
    _Var1._M_nxt = local_68._M_before_begin._M_nxt;
  } while (lVar5 != -0x50);
  for (; _Var1._M_nxt != (_Hash_node_base *)0x0; _Var1._M_nxt = (_Var1._M_nxt)->_M_nxt) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Key=",4);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(char *)_Var1._M_nxt[1]._M_nxt,
                        (long)_Var1._M_nxt[2]._M_nxt);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," Value=",7);
    plVar3 = (long *)std::ostream::operator<<(poVar2,*(int *)&_Var1._M_nxt[5]._M_nxt);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    local_d0 = local_c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,_Var1._M_nxt[1]._M_nxt,
               (long)&(_Var1._M_nxt[1]._M_nxt)->_M_nxt + (long)&(_Var1._M_nxt[2]._M_nxt)->_M_nxt);
    local_b0 = *(int *)&_Var1._M_nxt[5]._M_nxt;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Copied Key=",0xb);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,local_d0,local_c8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," Copied Value=",0xe);
    plVar3 = (long *)std::ostream::operator<<(poVar2,local_b0);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
    if (local_d0 != local_c0) {
      operator_delete(local_d0);
    }
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_68);
  if (local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  // Let's create a vector and iterate it using iterators.
  // Note that we are initializing the vector from an initialization list.
  std::vector<char> my_chars = {'a', 'b', 'c', 'd', 'e'};
  // Iterators are objects that allow the user to iterate a c++ collection.
  // These collections can be vectors, maps, sets, and others. Iterators
  // behave like points. That is that they can be incremented, decremented, and
  // dereferenced to access the content. This binary will give an example using
  // a vector and an unordered_map.
  // To get an iterator at the beginning of the collection, we call the method
  // begin(). If we desire to get an iterator at the end, we simply call the
  // method end(). The end of a collection does not point to the last entry. It
  // points to the subsequent entry where new data can be stored.
  // Iterators can be compared, for instance, the iterators begin() <= end(), or
  // begin() != end().
  // Note that the iterators require to know the collection and the type it
  // holds.
  std::vector<char>::iterator iterator = my_chars.begin();
  std::vector<char>::iterator ending_iterator = my_chars.end();
  // The for loop will use the iterator that points at the beginning of the
  // vector to access the elements in it.
  std::cout << "Print out the vector:\n";
  for (; iterator != ending_iterator; ++iterator) {
    // To acccess the value of an iterator, we use the dereference operator
    // as if the iterator was a pointer.
    std::cout << *iterator << std::endl;
  }
  // Since iterators act like points, we can change the value of entries.
  // For instance, to change the value of the first entry.
  iterator = my_chars.begin();
  *iterator = 'x';
  // The for loop will use the iterator that points at the beginning of the
  // vector to access the elements in it.
  std::cout << "Print out the vector:\n";
  for (; iterator != ending_iterator; ++iterator) {
    // To acccess the value of an iterator, we use the dereference operator
    // as if the iterator was a pointer.
    std::cout << *iterator << std::endl;
  }

  // Let's create a map and iterate it using iterators.
  std::unordered_map<std::string, int> name_to_id =
      {{"victor", 1}, {"john", 2}};
  // Let's define an iterator for this map. Remember that the iterators must
  // know the structure and the type they point to.
  std::unordered_map<std::string, int>::iterator map_iterator;
  // Let map_iterator point to the begining of the map.
  map_iterator = name_to_id.begin();
  for (; map_iterator != name_to_id.end(); ++map_iterator) {
    // Remember that the internal structure of a map is an std::pair. Recall
    // that std::pair has two members: first and second. Since iterator acts
    // like a pointer we need to use the '->' operator to access the members
    // of the pair. For instance:
    std::cout << "Key=" << map_iterator->first
              << " Value=" << map_iterator->second
              << std::endl;
    // To clarify this, let's make a copy of the pointer pair. To make the copy
    // we declare a pair with the same data type for its members. Then, we
    // dereference the iterator to access the pointed value.
    std::pair<std::string, int> copy_of_pair = *map_iterator;
    std::cout << "Copied Key=" << copy_of_pair.first
              << " Copied Value=" << copy_of_pair.second
              << std::endl;
  }
  return 0;
}